

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTKData.h
# Opt level: O2

void __thiscall
Detail::VTKPointDescriptorEntryImpl<MercuryParticle<2UL>,_double[3]>::VTKPointDescriptorEntryImpl
          (VTKPointDescriptorEntryImpl<MercuryParticle<2UL>,_double[3]> *this,string *name,
          offset_in_MercuryParticle<2UL>_to_unknown member,size_t nComponents)

{
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  VTKPointDescriptorEntry<MercuryParticle<2UL>_>::VTKPointDescriptorEntry
            (&this->super_VTKPointDescriptorEntry<MercuryParticle<2UL>_>,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_VTKPointDescriptorEntry<MercuryParticle<2UL>_>)._vptr_VTKPointDescriptorEntry =
       (_func_int **)&PTR__VTKPointDescriptorEntry_00110c58;
  this->member_ = member;
  this->nComponents_ = nComponents;
  return;
}

Assistant:

VTKPointDescriptorEntryImpl(std::string name, V T::*member, std::size_t nComponents)
        : VTKPointDescriptorEntry<T>(name), member_(member), nComponents_(nComponents)
      { }